

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O1

vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_> *
vk::getPhysicalDeviceSparseImageFormatProperties
          (vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
           *__return_storage_ptr__,InstanceInterface *vk,VkPhysicalDevice physicalDevice,
          VkFormat format,VkImageType type,VkSampleCountFlagBits samples,VkImageUsageFlags usage,
          VkImageTiling tiling)

{
  uint in_EAX;
  TestError *this;
  ulong uStack_38;
  deUint32 numProp;
  
  uStack_38 = (ulong)in_EAX;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*vk->_vptr_InstanceInterface[0xc])
            (vk,physicalDevice,(ulong)format,(ulong)type,samples,(ulong)usage,(ulong)tiling,&numProp
             ,0);
  if (uStack_38 >> 0x20 != 0) {
    std::
    vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>::
    resize(__return_storage_ptr__,uStack_38 >> 0x20);
    (*vk->_vptr_InstanceInterface[0xc])
              (vk,physicalDevice,(ulong)format,(ulong)type,samples,(ulong)usage,(ulong)tiling,
               &numProp,(__return_storage_ptr__->
                        super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if (((long)(__return_storage_ptr__->
               super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
               )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333 -
        (uStack_38 >> 0x20) != 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Returned sparse image properties count changes between queries",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x85);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSparseImageFormatProperties> getPhysicalDeviceSparseImageFormatProperties(const InstanceInterface& vk, VkPhysicalDevice physicalDevice, VkFormat format, VkImageType type, VkSampleCountFlagBits samples, VkImageUsageFlags usage, VkImageTiling tiling)
{
	deUint32								numProp = 0;
	vector<VkSparseImageFormatProperties>	properties;

	vk.getPhysicalDeviceSparseImageFormatProperties(physicalDevice, format, type, samples, usage, tiling, &numProp, DE_NULL);

	if (numProp > 0)
	{
		properties.resize(numProp);
		vk.getPhysicalDeviceSparseImageFormatProperties(physicalDevice, format, type, samples, usage, tiling, &numProp, &properties[0]);

		if ((size_t)numProp != properties.size())
			TCU_FAIL("Returned sparse image properties count changes between queries");
	}

	return properties;
}